

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O0

ecs_iter_t *
ecs_filter_iter(ecs_iter_t *__return_storage_ptr__,ecs_world_t *world,ecs_filter_t *filter)

{
  ecs_type_t local_70;
  ecs_filter_iter_t iter;
  ecs_filter_t *filter_local;
  ecs_world_t *world_local;
  
  iter.table.references = (ecs_ref_t *)filter;
  if (filter == (ecs_filter_t *)0x0) {
    memset(&local_70,0,0x18);
  }
  else {
    local_70 = filter->include;
    iter.filter.include = filter->exclude;
    iter.filter.exclude = *(ecs_type_t *)&filter->include_kind;
  }
  iter.filter._16_8_ = (world->store).tables;
  iter.tables._0_4_ = 0;
  memset(&iter.index,0,0x30);
  __return_storage_ptr__->world = world;
  __return_storage_ptr__->real_world = (ecs_world_t *)0x0;
  __return_storage_ptr__->system = 0;
  __return_storage_ptr__->kind = EcsQuerySimpleIter;
  __return_storage_ptr__->table = (ecs_iter_table_t *)0x0;
  __return_storage_ptr__->query = (ecs_query_t *)0x0;
  __return_storage_ptr__->table_count = 0;
  __return_storage_ptr__->inactive_table_count = 0;
  __return_storage_ptr__->column_count = 0;
  __return_storage_ptr__->table_columns = (void *)0x0;
  __return_storage_ptr__->entities = (ecs_entity_t *)0x0;
  __return_storage_ptr__->param = (void *)0x0;
  __return_storage_ptr__->delta_time = 0.0;
  __return_storage_ptr__->delta_system_time = 0.0;
  __return_storage_ptr__->world_time = 0.0;
  __return_storage_ptr__->frame_offset = 0;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->count = 0;
  __return_storage_ptr__->total_count = 0;
  __return_storage_ptr__->triggered_by = (ecs_entities_t *)0x0;
  __return_storage_ptr__->interrupted_by = 0;
  memcpy(&__return_storage_ptr__->iter,&local_70,0x58);
  return __return_storage_ptr__;
}

Assistant:

ecs_iter_t ecs_filter_iter(
    ecs_world_t *world,
    const ecs_filter_t *filter)
{
    ecs_filter_iter_t iter = {
        .filter = filter ? *filter : (ecs_filter_t){0},
        .tables = world->store.tables,
        .index = 0
    };

    return (ecs_iter_t){
        .world = world,
        .iter.filter = iter
    };
}